

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

target_ulong helper_mftc0_debug_mips64el(CPUMIPSState_conflict5 *env)

{
  CPUMIPSState_conflict5 *pCVar1;
  CPUMIPSState_conflict5 *other;
  int32_t tcstatus;
  int other_tc;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  _tcstatus = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  if (other._4_4_ == pCVar1->current_tc) {
    other._0_4_ = (pCVar1->active_tc).CP0_Debug_tcstatus;
  }
  else {
    other._0_4_ = pCVar1->tcs[(int)other._4_4_].CP0_Debug_tcstatus;
  }
  return (long)(int)(pCVar1->CP0_Debug & 0xfbfffeffU | (uint)other & 0x4000100);
}

Assistant:

target_ulong helper_mftc0_debug(CPUMIPSState *env)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    int32_t tcstatus;
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        tcstatus = other->active_tc.CP0_Debug_tcstatus;
    } else {
        tcstatus = other->tcs[other_tc].CP0_Debug_tcstatus;
    }

    /* XXX: Might be wrong, check with EJTAG spec. */
    return (other->CP0_Debug & ~((1 << CP0DB_SSt) | (1 << CP0DB_Halt))) |
            (tcstatus & ((1 << CP0DB_SSt) | (1 << CP0DB_Halt)));
}